

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

uint __thiscall node::anon_unknown_2::ChainImpl::estimateMaxBlocks(ChainImpl *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  FeeEstimateHorizon in_stack_0000000c;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
                      *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (bVar2) {
    std::unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>::operator->
              ((unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_c = CBlockPolicyEstimator::HighestTargetTracked
                        ((CBlockPolicyEstimator *)this,in_stack_0000000c);
  }
  else {
    local_c = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int estimateMaxBlocks() override
    {
        if (!m_node.fee_estimator) return 0;
        return m_node.fee_estimator->HighestTargetTracked(FeeEstimateHorizon::LONG_HALFLIFE);
    }